

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::Print(Message *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer local_a0;
  ZeroCopyOutputStream *local_18;
  ZeroCopyOutputStream *output_local;
  Message *message_local;
  
  local_18 = output;
  output_local = (ZeroCopyOutputStream *)message;
  Printer::Printer(&local_a0);
  bVar1 = Printer::Print(&local_a0,(Message *)output_local,local_18);
  Printer::~Printer(&local_a0);
  return bVar1;
}

Assistant:

bool TextFormat::Print(const Message& message,
                                    io::ZeroCopyOutputStream* output) {
  return Printer().Print(message, output);
}